

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_impl.h
# Opt level: O0

void __thiscall
node::Node<label::StringLabel>::Node(Node<label::StringLabel> *this,ConstReference label)

{
  ConstReference label_local;
  Node<label::StringLabel> *this_local;
  
  std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
  vector(&this->children_);
  ::label::StringLabel::StringLabel(&this->label_,label);
  return;
}

Assistant:

Node<Label>::Node(ConstReference label) : label_(label) {}